

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_fill_poly_convex
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  undefined8 uVar1;
  undefined8 uVar2;
  nk_vec2 uv;
  nk_buffer *b;
  void *pvVar3;
  nk_size nVar4;
  void *pvVar5;
  nk_vec2 pos;
  nk_vec2 pos_00;
  void *pvVar6;
  nk_draw_index *pnVar7;
  void *pvVar8;
  nk_draw_index nVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  nk_draw_index nVar16;
  float fVar17;
  nk_draw_index nVar18;
  uint uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_size index;
  nk_colorf col;
  
  if (2 < points_count && list != (nk_draw_list *)0x0) {
    config = &list->config;
    nk_color_fv(&col.r,(nk_color)
                       ((uint)color & 0xffffff |
                       (int)((float)((uint)color >> 0x18) * (list->config).global_alpha) << 0x18));
    uVar19 = list->vertex_count;
    nVar16 = (nk_draw_index)uVar19;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      pvVar6 = nk_draw_list_alloc_vertices(list,(ulong)(points_count * 2));
      pnVar7 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 9 - 6));
      if (pnVar7 != (nk_draw_index *)0x0 && pvVar6 != (void *)0x0) {
        b = list->vertices;
        pvVar3 = (b->memory).ptr;
        nVar4 = b->allocated;
        b->marker[0].active = 1;
        b->marker[0].offset = nVar4;
        uVar14 = (ulong)points_count;
        pvVar8 = nk_buffer_alloc(b,NK_BUFFER_FRONT,uVar14 * 8,4);
        if (pvVar8 != (void *)0x0) {
          pvVar5 = (list->vertices->memory).ptr;
          lVar11 = uVar14 - 2;
          iVar15 = uVar19 + 2;
          while (bVar20 = lVar11 != 0, lVar11 = lVar11 + -1, bVar20) {
            *pnVar7 = nVar16;
            pnVar7[1] = (nk_draw_index)iVar15;
            iVar15 = iVar15 + 2;
            pnVar7[2] = (nk_draw_index)iVar15;
            pnVar7 = pnVar7 + 3;
          }
          uVar12 = (ulong)(points_count - 1);
          for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
            fVar22 = points[uVar13].x - points[uVar12].x;
            fVar21 = points[uVar13].y - points[uVar12].y;
            fVar23 = fVar22 * fVar22 + fVar21 * fVar21;
            fVar17 = 1.0;
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              fVar17 = (float)(0x5f375a84 - ((uint)fVar23 >> 1));
              fVar17 = (fVar23 * -0.5 * fVar17 * fVar17 + 1.5) * fVar17;
            }
            *(ulong *)((long)pvVar8 + uVar12 * 8) = CONCAT44(fVar17 * -fVar22,fVar17 * fVar21);
            uVar12 = uVar13;
          }
          pvVar6 = (void *)((long)pvVar6 + ((long)pvVar5 - (long)pvVar3));
          uVar12 = 0;
          uVar13 = (ulong)(points_count - 1);
          while (uVar10 = uVar12, uVar14 != uVar10) {
            uVar1 = *(undefined8 *)((long)pvVar8 + uVar13 * 8);
            uVar2 = *(undefined8 *)((long)pvVar8 + uVar10 * 8);
            fVar21 = ((float)uVar2 + (float)uVar1) * 0.5;
            fVar22 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
            fVar17 = fVar21 * fVar21 + fVar22 * fVar22;
            if (1e-06 < fVar17) {
              fVar17 = 1.0 / fVar17;
              if (100.0 <= fVar17) {
                fVar17 = 100.0;
              }
              fVar21 = fVar21 * fVar17;
              fVar22 = fVar22 * fVar17;
            }
            uv = (list->config).null.uv;
            color_01.b = col.b;
            color_01.a = col.a;
            color_01.r = col.r;
            color_01.g = col.g;
            pos.y = points[uVar10].y - fVar22 * 0.5;
            pos.x = points[uVar10].x - fVar21 * 0.5;
            pvVar6 = nk_draw_vertex(pvVar6,config,pos,uv,color_01);
            color_02.b = (float)(int)(col._8_8_ & 0xffffffff);
            color_02.a = (float)(int)((col._8_8_ & 0xffffffff) >> 0x20);
            color_02.r = col.r;
            color_02.g = col.g;
            pos_00.y = points[uVar10].y + fVar22 * 0.5;
            pos_00.x = points[uVar10].x + fVar21 * 0.5;
            pvVar6 = nk_draw_vertex(pvVar6,config,pos_00,uv,color_02);
            nVar18 = (nk_draw_index)uVar19;
            *pnVar7 = nVar18;
            pnVar7[1] = nVar16 + (short)uVar13 * 2;
            nVar9 = nVar16 + 1 + (short)uVar13 * 2;
            pnVar7[2] = nVar9;
            pnVar7[3] = nVar9;
            pnVar7[4] = nVar18 + 1;
            pnVar7[5] = nVar18;
            pnVar7 = pnVar7 + 6;
            uVar19 = uVar19 + 2;
            uVar13 = uVar10;
            uVar12 = uVar10 + 1;
          }
          nk_buffer_reset(list->vertices,NK_BUFFER_FRONT);
          return;
        }
      }
    }
    else {
      uVar14 = (ulong)points_count;
      pvVar6 = nk_draw_list_alloc_vertices(list,uVar14);
      pnVar7 = nk_draw_list_alloc_elements(list,(ulong)(points_count * 3 - 6));
      if (pnVar7 != (nk_draw_index *)0x0 && pvVar6 != (void *)0x0) {
        for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
          color_00.b = col.b;
          color_00.a = col.a;
          color_00.r = col.r;
          color_00.g = col.g;
          pvVar6 = nk_draw_vertex(pvVar6,config,points[uVar12],(list->config).null.uv,color_00);
        }
        iVar15 = uVar19 + 2;
        for (lVar11 = 0; uVar14 * 6 + -0xc != lVar11; lVar11 = lVar11 + 6) {
          *(nk_draw_index *)((long)pnVar7 + lVar11) = nVar16;
          *(short *)((long)pnVar7 + lVar11 + 2) = (short)iVar15 + -1;
          *(short *)((long)pnVar7 + lVar11 + 4) = (short)iVar15;
          iVar15 = iVar15 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_poly_convex(struct nk_draw_list *list,
const struct nk_vec2 *points, const unsigned int points_count,
struct nk_color color, enum nk_anti_aliasing aliasing)
{
struct nk_colorf col;
struct nk_colorf col_trans;

NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);
NK_ASSERT(list);
if (!list || points_count < 3) return;

#ifdef NK_INCLUDE_COMMAND_USERDATA
nk_draw_list_push_userdata(list, list->userdata);
#endif

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
nk_color_fv(&col.r, color);
col_trans = col;
col_trans.a = 0;

if (aliasing == NK_ANTI_ALIASING_ON) {
nk_size i = 0;
nk_size i0 = 0;
nk_size i1 = 0;

const float AA_SIZE = 1.0f;
nk_size vertex_offset = 0;
nk_size index = list->vertex_count;

const nk_size idx_count = (points_count-2)*3 + points_count*6;
const nk_size vtx_count = (points_count*2);

void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

nk_size size = 0;
struct nk_vec2 *normals = 0;
unsigned int vtx_inner_idx = (unsigned int)(index + 0);
unsigned int vtx_outer_idx = (unsigned int)(index + 1);
if (!vtx || !ids) return;

/* temporary allocate normals */
vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
size = pnt_size * points_count;
normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
if (!normals) return;
vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

/* add elements */
for (i = 2; i < points_count; i++) {
ids[0] = (nk_draw_index)(vtx_inner_idx);
ids[1] = (nk_draw_index)(vtx_inner_idx + ((i-1) << 1));
ids[2] = (nk_draw_index)(vtx_inner_idx + (i << 1));
ids += 3;
}

/* compute normals */
for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
struct nk_vec2 p0 = points[i0];
struct nk_vec2 p1 = points[i1];
struct nk_vec2 diff = nk_vec2_sub(p1, p0);

/* vec2 inverted length  */
float len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;
diff = nk_vec2_muls(diff, len);

normals[i0].x = diff.y;
normals[i0].y = -diff.x;
}

/* add vertices + indexes */
for (i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++) {
const struct nk_vec2 uv = list->config.null.uv;
struct nk_vec2 n0 = normals[i0];
struct nk_vec2 n1 = normals[i1];
struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(n0, n1), 0.5f);
float dmr2 = dm.x*dm.x + dm.y*dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f / dmr2;
scale = NK_MIN(scale, 100.0f);
dm = nk_vec2_muls(dm, scale);
}
dm = nk_vec2_muls(dm, AA_SIZE * 0.5f);

/* add vertices */
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_sub(points[i1], dm), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2_add(points[i1], dm), uv, col_trans);

/* add indexes */
ids[0] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
ids[1] = (nk_draw_index)(vtx_inner_idx+(i0<<1));
ids[2] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
ids[3] = (nk_draw_index)(vtx_outer_idx+(i0<<1));
ids[4] = (nk_draw_index)(vtx_outer_idx+(i1<<1));
ids[5] = (nk_draw_index)(vtx_inner_idx+(i1<<1));
ids += 6;
}
/* free temporary normals + points */
nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
} else {
nk_size i = 0;
nk_size index = list->vertex_count;
const nk_size idx_count = (points_count-2)*3;
const nk_size vtx_count = points_count;
void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

if (!vtx || !ids) return;
for (i = 0; i < vtx_count; ++i)
vtx = nk_draw_vertex(vtx, &list->config, points[i], list->config.null.uv, col);
for (i = 2; i < points_count; ++i) {
ids[0] = (nk_draw_index)index;
ids[1] = (nk_draw_index)(index+ i - 1);
ids[2] = (nk_draw_index)(index+i);
ids += 3;
}
}
}